

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O0

QString * __thiscall
Mustache::Renderer::render
          (QString *__return_storage_ptr__,Renderer *this,QString *_template,int startPos,int endPos
          ,Context *context)

{
  qsizetype *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  qsizetype qVar5;
  QString *pQVar6;
  QStringView v;
  QString local_340;
  undefined1 local_328 [8];
  QString partialRendered;
  QString local_2f8;
  QString local_2e0;
  QString local_2c8;
  int local_2ac;
  undefined1 local_2a8 [4];
  int posOfLF;
  QString local_290;
  undefined1 local_278 [8];
  QString partialContent;
  QString tagEndMarker;
  QString tagStartMarker;
  QString local_218;
  QString local_200;
  undefined1 local_1e8 [8];
  Tag endTag_1;
  QString local_1a0;
  QString local_188;
  QString local_170;
  uint local_158;
  int local_154;
  int i;
  int listCount;
  undefined1 local_138 [8];
  Tag endTag;
  QString local_f0;
  undefined1 local_d8 [8];
  QString value;
  int local_9c;
  QStringView local_98;
  QStringView local_88;
  undefined1 local_68 [8];
  Tag tag;
  int lastTagEnd;
  Context *context_local;
  int endPos_local;
  int startPos_local;
  QString *_template_local;
  Renderer *this_local;
  QString *output;
  
  tag.indentation._3_1_ = 0;
  QString::QString(__return_storage_ptr__);
  tag.escapeMode = startPos;
  do {
    if (this->m_errorPos != -1) {
      return __return_storage_ptr__;
    }
    findTag((Tag *)local_68,this,_template,tag.escapeMode,endPos);
    if (local_68._0_4_ == Null) {
      QStringView::QStringView<QString,_true>(&local_98,_template);
      local_88 = QStringView::mid(&local_98,(long)(int)tag.escapeMode,
                                  (long)(int)(endPos - tag.escapeMode));
      QString::operator+=(__return_storage_ptr__,local_88);
      local_9c = 3;
    }
    else {
      this_00 = &value.d.size;
      QStringView::QStringView<QString,_true>((QStringView *)this_00,_template);
      v = QStringView::mid((QStringView *)this_00,(long)(int)tag.escapeMode,
                           (long)(int)((int)tag.key.d.size - tag.escapeMode));
      QString::operator+=(__return_storage_ptr__,v);
      switch(local_68._0_4_) {
      case 1:
        (*context->_vptr_Context[2])(local_d8,context,&tag);
        if (tag.start == 0) {
          escapeHtml(&local_f0,(QString *)local_d8);
          QString::operator=((QString *)local_d8,&local_f0);
          QString::~QString(&local_f0);
        }
        else if (tag.start == 1) {
          unescapeHtml((QString *)&endTag.escapeMode,(QString *)local_d8);
          QString::operator=((QString *)local_d8,(QString *)&endTag.escapeMode);
          QString::~QString((QString *)&endTag.escapeMode);
        }
        QString::operator+=(__return_storage_ptr__,(QString *)local_d8);
        tag.escapeMode = tag.key.d.size._4_4_;
        QString::~QString((QString *)local_d8);
        break;
      case 2:
        findEndTag((Tag *)local_138,this,_template,(Tag *)local_68,endPos);
        if (local_138._0_4_ == Null) {
          if (this->m_errorPos == -1) {
            QString::QString((QString *)&i,"No matching end tag found for section");
            setError(this,(QString *)&i,(int)tag.key.d.size);
            QString::~QString((QString *)&i);
          }
        }
        else {
          local_154 = (*context->_vptr_Context[4])(context,&tag);
          if (local_154 < 1) {
            uVar2 = (*context->_vptr_Context[7])(context,&tag);
            if ((uVar2 & 1) == 0) {
              uVar2 = (*context->_vptr_Context[3])(context,&tag);
              if ((uVar2 & 1) == 0) {
                (*context->_vptr_Context[5])(context,&tag,0xffffffff);
                render((QString *)&endTag_1.escapeMode,this,_template,tag.key.d.size._4_4_,
                       (int)endTag.key.d.size,context);
                QString::operator+=(__return_storage_ptr__,(QString *)&endTag_1.escapeMode);
                QString::~QString((QString *)&endTag_1.escapeMode);
                (*context->_vptr_Context[6])();
              }
            }
            else {
              QString::mid((longlong)&local_1a0,(longlong)_template);
              (*context->_vptr_Context[8])(&local_188,context,&tag,&local_1a0,this);
              QString::operator+=(__return_storage_ptr__,&local_188);
              QString::~QString(&local_188);
              QString::~QString(&local_1a0);
            }
          }
          else {
            for (local_158 = 0; (int)local_158 < local_154; local_158 = local_158 + 1) {
              (*context->_vptr_Context[5])(context,&tag,(ulong)local_158);
              render(&local_170,this,_template,tag.key.d.size._4_4_,(int)endTag.key.d.size,context);
              QString::operator+=(__return_storage_ptr__,&local_170);
              QString::~QString(&local_170);
              (*context->_vptr_Context[6])();
            }
          }
          tag.escapeMode = endTag.key.d.size._4_4_;
        }
        Tag::~Tag((Tag *)local_138);
        break;
      case 3:
        findEndTag((Tag *)local_1e8,this,_template,(Tag *)local_68,endPos);
        if (local_1e8._0_4_ == Null) {
          if (this->m_errorPos == -1) {
            QString::QString(&local_200,"No matching end tag found for inverted section");
            setError(this,&local_200,(int)tag.key.d.size);
            QString::~QString(&local_200);
          }
        }
        else {
          uVar2 = (*context->_vptr_Context[3])(context,&tag);
          if ((uVar2 & 1) != 0) {
            render(&local_218,this,_template,tag.key.d.size._4_4_,(int)endTag_1.key.d.size,context);
            QString::operator+=(__return_storage_ptr__,&local_218);
            QString::~QString(&local_218);
          }
          tag.escapeMode = endTag_1.key.d.size._4_4_;
        }
        Tag::~Tag((Tag *)local_1e8);
        break;
      case 4:
        QString::QString((QString *)&tagStartMarker.d.size,"Unexpected end tag");
        setError(this,(QString *)&tagStartMarker.d.size,(int)tag.key.d.size);
        QString::~QString((QString *)&tagStartMarker.d.size);
        tag.escapeMode = tag.key.d.size._4_4_;
        break;
      case 5:
        QString::QString((QString *)&tagEndMarker.d.size,&this->m_tagStartMarker);
        QString::QString((QString *)&partialContent.d.size,&this->m_tagEndMarker);
        QString::operator=(&this->m_tagStartMarker,(QString *)&this->m_defaultTagStartMarker);
        QString::operator=(&this->m_tagEndMarker,(QString *)&this->m_defaultTagEndMarker);
        QStack<QString>::push(&this->m_partialStack,(QString *)&tag);
        Context::partialValue((QString *)local_278,context,(QString *)&tag);
        if (0 < tag.end) {
          QString::QString((QString *)local_2a8," ");
          QString::repeated((longlong)&local_290);
          QString::operator+=(__return_storage_ptr__,&local_290);
          QString::~QString(&local_290);
          QString::~QString((QString *)local_2a8);
          QString::QString(&local_2c8,"\n");
          iVar3 = QString::indexOf((QString *)local_278,(longlong)&local_2c8,CaseInsensitive);
          QString::~QString(&local_2c8);
          local_2ac = iVar3;
          while( true ) {
            bVar1 = false;
            if (0 < local_2ac) {
              lVar4 = (long)local_2ac;
              qVar5 = QString::length((QString *)local_278);
              bVar1 = lVar4 < qVar5 + -1;
            }
            if (!bVar1) break;
            iVar3 = local_2ac + 1;
            QString::QString(&local_2f8," ");
            QString::repeated((longlong)&local_2e0);
            pQVar6 = QString::insert((QString *)local_278,(long)iVar3,&local_2e0);
            QString::operator=((QString *)local_278,(QString *)pQVar6);
            QString::~QString(&local_2e0);
            QString::~QString(&local_2f8);
            QString::QString((QString *)&partialRendered.d.size,"\n");
            local_2ac = QString::indexOf((QString *)local_278,(longlong)&partialRendered.d.size,
                                         local_2ac + CaseSensitive);
            QString::~QString((QString *)&partialRendered.d.size);
          }
        }
        qVar5 = QString::length((QString *)local_278);
        render((QString *)local_328,this,(QString *)local_278,0,(int)qVar5,context);
        QString::operator+=(__return_storage_ptr__,(QString *)local_328);
        tag.escapeMode = tag.key.d.size._4_4_;
        QStack<QString>::pop(&local_340,&this->m_partialStack);
        QString::~QString(&local_340);
        QString::operator=(&this->m_tagStartMarker,(QString *)&tagEndMarker.d.size);
        QString::operator=(&this->m_tagEndMarker,(QString *)&partialContent.d.size);
        QString::~QString((QString *)local_328);
        QString::~QString((QString *)local_278);
        QString::~QString((QString *)&partialContent.d.size);
        QString::~QString((QString *)&tagEndMarker.d.size);
        break;
      case 6:
        tag.escapeMode = tag.key.d.size._4_4_;
        break;
      case 7:
        tag.escapeMode = tag.key.d.size._4_4_;
      }
      local_9c = 0;
    }
    Tag::~Tag((Tag *)local_68);
  } while (local_9c == 0);
  return __return_storage_ptr__;
}

Assistant:

QString Renderer::render(const QString& _template, int startPos, int endPos, Context* context)
{
	QString output;
	int lastTagEnd = startPos;

	while (m_errorPos == -1) {
		Tag tag = findTag(_template, lastTagEnd, endPos);
		if (tag.type == Tag::Null) {
			output += QStringView(_template).mid(lastTagEnd, endPos - lastTagEnd);
			break;
		}
		output += QStringView(_template).mid(lastTagEnd, tag.start - lastTagEnd);
		switch (tag.type) {
		case Tag::Value:
		{
			QString value = context->stringValue(tag.key);
			if (tag.escapeMode == Tag::Escape) {
				value = escapeHtml(value);
			} else if (tag.escapeMode == Tag::Unescape) {
				value = unescapeHtml(value);
			}
			output += value;
			lastTagEnd = tag.end;
		}
		break;
		case Tag::SectionStart:
		{
			Tag endTag = findEndTag(_template, tag, endPos);
			if (endTag.type == Tag::Null) {
				if (m_errorPos == -1) {
					setError("No matching end tag found for section", tag.start);
				}
			} else {
				int listCount = context->listCount(tag.key);
				if (listCount > 0) {
					for (int i=0; i < listCount; i++) {
						context->push(tag.key, i);
						output += render(_template, tag.end, endTag.start, context);
						context->pop();
					}
				} else if (context->canEval(tag.key)) {
					output += context->eval(tag.key, _template.mid(tag.end, endTag.start - tag.end), this);
				} else if (!context->isFalse(tag.key)) {
					context->push(tag.key);
					output += render(_template, tag.end, endTag.start, context);
					context->pop();
				}
				lastTagEnd = endTag.end;
			}
		}
		break;
		case Tag::InvertedSectionStart:
		{
			Tag endTag = findEndTag(_template, tag, endPos);
			if (endTag.type == Tag::Null) {
				if (m_errorPos == -1) {
					setError("No matching end tag found for inverted section", tag.start);
				}
			} else {
				if (context->isFalse(tag.key)) {
					output += render(_template, tag.end, endTag.start, context);
				}
				lastTagEnd = endTag.end;
			}
		}
		break;
		case Tag::SectionEnd:
			setError("Unexpected end tag", tag.start);
			lastTagEnd = tag.end;
			break;
		case Tag::Partial:
		{
			QString tagStartMarker = m_tagStartMarker;
			QString tagEndMarker = m_tagEndMarker;

			m_tagStartMarker = m_defaultTagStartMarker;
			m_tagEndMarker = m_defaultTagEndMarker;

			m_partialStack.push(tag.key);

			QString partialContent = context->partialValue(tag.key);

			// If there is a need to add a special indentation to the partial
			if (tag.indentation > 0) {
				output += QString(" ").repeated(tag.indentation);
				// Indenting the output to keep the parent indentation.
				int posOfLF = partialContent.indexOf("\n", 0);
				while (posOfLF > 0 && posOfLF < (partialContent.length() - 1)) { // .length() - 1 because we dont want indentation AFTER the last character if it's a LF
					partialContent = partialContent.insert(posOfLF + 1, QString(" ").repeated(tag.indentation));
					posOfLF = partialContent.indexOf("\n", posOfLF + 1);
				}
			}

			QString partialRendered = render(partialContent, 0, partialContent.length(), context);

			output += partialRendered;

			lastTagEnd = tag.end;

			m_partialStack.pop();

			m_tagStartMarker = tagStartMarker;
			m_tagEndMarker = tagEndMarker;
		}
		break;
		case Tag::SetDelimiter:
			lastTagEnd = tag.end;
			break;
		case Tag::Comment:
			lastTagEnd = tag.end;
			break;
		case Tag::Null:
			break;
		}
	}

	return output;
}